

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_front.c
# Opt level: O0

PaError Pa_CloseStream(PaStream *stream)

{
  undefined8 *puVar1;
  int local_1c;
  PaError result;
  PaUtilStreamInterface *interface;
  PaStream *stream_local;
  
  local_1c = PaUtil_ValidateStreamPointer(stream);
  RemoveOpenStream(stream);
  if (local_1c == 0) {
    puVar1 = *(undefined8 **)((long)stream + 0x10);
    local_1c = (*(code *)puVar1[4])(stream);
    if (local_1c == 1) {
      local_1c = 0;
    }
    else if (local_1c == 0) {
      local_1c = (*(code *)puVar1[3])(stream);
    }
    if (local_1c == 0) {
      local_1c = (*(code *)*puVar1)(stream);
    }
  }
  return local_1c;
}

Assistant:

PaError Pa_CloseStream( PaStream* stream )
{
    PaUtilStreamInterface *interface;
    PaError result = PaUtil_ValidateStreamPointer( stream );

    PA_LOGAPI_ENTER_PARAMS( "Pa_CloseStream" );
    PA_LOGAPI(("\tPaStream* stream: 0x%p\n", stream ));

    /* always remove the open stream from our list, even if this function
        eventually returns an error. Otherwise CloseOpenStreams() will
        get stuck in an infinite loop */
    RemoveOpenStream( stream ); /* be sure to call this _before_ closing the stream */

    if( result == paNoError )
    {
        interface = PA_STREAM_INTERFACE(stream);

        /* abort the stream if it isn't stopped */
        result = interface->IsStopped( stream );
        if( result == 1 )
            result = paNoError;
        else if( result == 0 )
            result = interface->Abort( stream );

        if( result == paNoError )                 /** @todo REVIEW: shouldn't we close anyway? see: http://www.portaudio.com/trac/ticket/115 */
            result = interface->Close( stream );
    }

    PA_LOGAPI_EXIT_PAERROR( "Pa_CloseStream", result );

    return result;
}